

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::ResetCollectionState(Recycler *this)

{
  ObservableValueObserver<Memory::CollectionState> *pOVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  size_t sVar5;
  CollectionState local_1c;
  
  bVar3 = IsMarkStackEmpty(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x903,"(IsMarkStackEmpty())","IsMarkStackEmpty()");
    if (!bVar3) goto LAB_0070d382;
    *puVar4 = 0;
  }
  local_1c = CollectionStateNotCollecting;
  pOVar1 = (this->collectionState).observer;
  if ((pOVar1 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateNotCollecting)) {
    (**pOVar1->_vptr_ObservableValueObserver)(pOVar1,&local_1c,&this->collectionState);
  }
  (this->collectionState).value = local_1c;
  this->backgroundFinishMarkCount = '\0';
  this->inExhaustiveCollection = false;
  this->inDecommitNowCollection = false;
  CleanupPendingUnroot(this);
  if (this->inPartialCollectMode == true) {
    FinishPartialCollect(this,(RecyclerSweepManager *)0x0);
  }
  bVar3 = DoQueueTrackedObject(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x917,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar3) {
LAB_0070d382:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  sVar5 = HeapInfoManager::GetFinalizeCount(&this->autoHeap);
  (this->collectionStats).finalizeCount = sVar5;
  return;
}

Assistant:

void
Recycler::ResetCollectionState()
{
    Assert(IsMarkStackEmpty());

    this->SetCollectionState(CollectionStateNotCollecting);
#if ENABLE_CONCURRENT_GC
    this->backgroundFinishMarkCount = 0;
#endif
    this->inExhaustiveCollection = false;
    this->inDecommitNowCollection = false;

#if ENABLE_CONCURRENT_GC
    CleanupPendingUnroot();
#endif

#if ENABLE_PARTIAL_GC
    if (inPartialCollectMode)
    {
        FinishPartialCollect();
    }
#endif
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    // Reset the collection stats.
    this->collectionStats.finalizeCount = this->autoHeap.GetFinalizeCount();
#endif
}